

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamma_dist.hpp
# Opt level: O0

result_type_conflict3 * __thiscall
trng::gamma_dist<long_double>::icdf(gamma_dist<long_double> *this,result_type_conflict3 x)

{
  undefined1 x_00 [16];
  int *piVar1;
  result_type_conflict3 *in_RDI;
  longdouble in_stack_00000008;
  undefined8 in_stack_ffffffffffffffe8;
  undefined2 in_stack_fffffffffffffff0;
  undefined6 in_stack_fffffffffffffff2;
  
  if ((in_stack_00000008 <= (longdouble)0) || ((longdouble)1 <= in_stack_00000008)) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    in_RDI = (result_type_conflict3 *)std::numeric_limits<long_double>::quiet_NaN();
  }
  else if ((in_stack_00000008 != (longdouble)0) || (NAN(in_stack_00000008) || NAN((longdouble)0))) {
    if ((in_stack_00000008 != (longdouble)1) || (NAN(in_stack_00000008) || NAN((longdouble)1))) {
      x_00._8_8_ = in_stack_ffffffffffffffe8;
      x_00._0_8_ = in_RDI;
      in_RDI = icdf_((gamma_dist<long_double> *)
                     CONCAT62(in_stack_fffffffffffffff2,in_stack_fffffffffffffff0),
                     (result_type_conflict3)x_00);
    }
    else {
      in_RDI = (result_type_conflict3 *)std::numeric_limits<long_double>::infinity();
    }
  }
  return in_RDI;
}

Assistant:

icdf(result_type x) const {
      if (x <= 0 or x >= 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      if (x == 0)
        return 0;
      if (x == 1)
        return math::numeric_limits<result_type>::infinity();
      return icdf_(x);
    }